

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

double __thiscall soplex::SPxMainSM<double>::feastol(SPxMainSM<double> *this)

{
  element_type *this_00;
  Real RVar1;
  
  SPxSimplifier<double>::tolerances((SPxSimplifier<double> *)&stack0xffffffffffffffe8);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x27f645);
  RVar1 = Tolerances::floatingPointFeastol(this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x27f65f);
  return RVar1;
}

Assistant:

R feastol() const
   {
      return this->tolerances()->floatingPointFeastol();
   }